

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O2

int deep_dump(nvamemtiming_conf *conf)

{
  uint8_t uVar1;
  ushort uVar2;
  value_type vVar3;
  uint8_t *puVar4;
  byte bVar5;
  int iVar6;
  FILE *__stream;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char filename [21];
  
  builtin_strncpy(filename,"regs_timing_deep",0x11);
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open regs_timing_deep");
    iVar6 = 1;
  }
  else {
    timing_value_types = nv40_timing_value_types;
    if (0xbf < nva_cards[conf->cnum].card_type) {
      timing_value_types = nvc0_timing_value_types;
    }
    bVar5 = (conf->field_4).manual.index;
    if (bVar5 == 0xff) {
      (conf->field_4).manual.index = '\0';
      bVar5 = 0;
    }
    if ((conf->field_4).manual.value == 0xff) {
      (conf->field_4).manual.value = (uint8_t)(conf->vbios).timing_entry_length;
    }
    uVar9 = 0;
    fprintf(_stderr,"Deep mode: Will iterate between %i and %i\n",(ulong)bVar5);
    launch(conf,(FILE *)__stream,'\0',NO_COLOR);
    while( true ) {
      uVar2 = (conf->vbios).timing_entry_length;
      if (uVar2 <= uVar9) break;
      uVar1 = (conf->vbios).data[(conf->vbios).timing_entry_offset + uVar9];
      vVar3 = timing_value_types[uVar9];
      if (vVar3 == VALUE) {
LAB_00102af9:
        if (conf->mode == MODE_DEEP) {
          puVar4 = (conf->vbios).data;
          uVar7 = uVar9 & 0xff;
          uVar8 = (uint)puVar4[(conf->vbios).timing_entry_offset + uVar7];
          bVar5 = puVar4[(conf->field_4).deep.timing_entry_offset + uVar7];
          while (uVar8 < bVar5) {
            uVar8 = uVar8 + 1;
            (conf->vbios).data[(conf->vbios).timing_entry_offset + uVar7] = (uint8_t)uVar8;
            launch(conf,(FILE *)__stream,(uint8_t)uVar9 + '\x01',COLOR);
          }
        }
      }
      else {
        if ((vVar3 == EMPTY) && (uVar1 != '\0')) {
          fwrite("WARNING: The following entry was supposed to be unused!\n",0x38,1,__stream);
          goto LAB_00102af9;
        }
        if (vVar3 == BITFIELD) {
          iterate_bitfield(conf,(FILE *)__stream,(uint8_t)uVar9,(uint)uVar2);
        }
        else if (vVar3 == EMPTY) {
          fprintf(__stream,"timing entry [%u/%u] is supposed empty\n\n",(ulong)((int)uVar9 + 1));
        }
      }
      (conf->vbios).data[(conf->vbios).timing_entry_offset + uVar9] = uVar1;
      uVar9 = uVar9 + 1;
    }
    fclose(__stream);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
deep_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == -1 ||  conf->range.end == -1)
		sprintf(filename, "regs_timing_deep_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing_deep");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing_deep");
		return 1;
	}

	if (nva_cards[conf->cnum].card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length;

	fprintf(stderr, "Deep mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = 0; i < conf->vbios.timing_entry_length; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			iterate_values(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}